

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O0

void Diligent::ValidateTextureDesc(TextureDesc *Desc,IRenderDevice *pDevice)

{
  SPARSE_RESOURCE_CAP_FLAGS a;
  SPARSE_RESOURCE_CAP_FLAGS a_00;
  SPARSE_RESOURCE_CAP_FLAGS a_01;
  SPARSE_RESOURCE_CAP_FLAGS a_02;
  undefined *puVar1;
  bool bVar2;
  MISC_TEXTURE_FLAGS MVar3;
  CPU_ACCESS_FLAGS CVar4;
  CPU_ACCESS_FLAGS CVar5;
  SHADING_RATE_CAP_FLAGS SVar6;
  BIND_FLAGS BVar7;
  BIND_FLAGS BVar8;
  Uint32 UVar9;
  SPARSE_RESOURCE_CAP_FLAGS SVar10;
  uint *puVar11;
  Char *Message;
  TextureFormatAttribs *pTVar12;
  undefined8 uVar13;
  long lVar14;
  RenderDeviceInfo *pRVar15;
  IRenderDevice *pIVar16;
  uint uVar17;
  char *in_stack_fffffffffffffa58;
  _func_int **local_540;
  _func_int **local_538;
  _func_int **local_530;
  _func_int **local_528;
  _func_int **local_500;
  _func_int **local_4f0;
  _func_int **local_4e8;
  _func_int **local_4d8;
  SparseResourceProperties *local_4d0;
  _func_int **local_4c8;
  _func_int **local_4c0;
  _func_int **local_4b8;
  _func_int **local_4a8;
  _func_int **local_490;
  _func_int **local_480;
  _func_int **local_478;
  _func_int **local_470;
  _func_int **local_468;
  _func_int **local_460;
  _func_int **local_458;
  _func_int **local_450;
  _func_int **local_448;
  _func_int **local_440;
  _func_int **local_438;
  _func_int **local_428;
  _func_int **local_420;
  _func_int **local_418;
  ShadingRateProperties *local_410;
  _func_int **local_408;
  _func_int **local_400;
  _func_int **local_3f0;
  _func_int **local_3e8;
  _func_int **local_3e0;
  _func_int **local_3d8;
  _func_int **local_3d0;
  _func_int **local_3c8;
  _func_int **local_3b0;
  _func_int **local_3a8;
  _func_int **local_398;
  _func_int **local_390;
  _func_int **local_388;
  _func_int **local_380;
  _func_int **local_370;
  _func_int **local_368;
  _func_int **local_360;
  _func_int **local_358;
  _func_int **local_350;
  _func_int **local_348;
  _func_int **local_340;
  _func_int **local_338;
  _func_int **local_330;
  _func_int **local_328;
  _func_int **local_320;
  _func_int **local_318;
  _func_int **local_310;
  _func_int **local_308;
  _func_int **local_300;
  _func_int **local_2f8;
  uint local_2f0 [3];
  uint local_2e4;
  anon_union_8_3_e2189aaa_for_Vector2<unsigned_int>_1 local_2e0;
  uint2 MipSize;
  SparseTextureProperties Props;
  _func_int **local_298;
  _func_int **local_290;
  RenderDeviceInfo *local_288;
  SparseResourceProperties *SparseRes;
  _func_int **local_278;
  _func_int **local_270;
  _func_int **local_268;
  _func_int **local_260;
  char local_251;
  String local_250;
  _func_int **local_230;
  _func_int **local_228;
  _func_int **local_220;
  _func_int **local_218;
  _func_int **local_210;
  _func_int **local_208;
  _func_int **local_200;
  _func_int **local_1f8;
  _func_int **local_1f0;
  _func_int **local_1e8;
  _func_int **local_1e0;
  _func_int **local_1d8;
  _func_int **local_1d0;
  _func_int **local_1c8;
  long local_1c0;
  ShadingRateProperties *SRProps;
  _func_int **local_1b0;
  _func_int **local_1a8;
  _func_int **local_1a0;
  _func_int **local_198;
  _func_int **local_190;
  _func_int **local_188;
  _func_int **local_180;
  _func_int **local_178;
  String local_170;
  _func_int **local_150;
  _func_int **local_148;
  DEVICE_FEATURE_STATE *local_140;
  AdapterMemoryInfo *MemInfo;
  string _msg;
  char *FmtName;
  _func_int **local_108;
  _func_int **local_100;
  _func_int **local_f8 [3];
  _func_int **local_e0;
  undefined1 local_d8 [8];
  string msg;
  _func_int **pp_Stack_b0;
  Uint32 MaxDim;
  _func_int **local_a8;
  _func_int **local_a0;
  _func_int **local_98;
  _func_int **local_90;
  uint local_84;
  _func_int **local_80;
  _func_int **local_78;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  RenderDeviceInfo *local_58;
  RenderDeviceInfo *DeviceInfo;
  GraphicsAdapterInfo *AdapterInfo;
  TextureFormatAttribs *FmtAttribs;
  IRenderDevice *pDevice_local;
  TextureDesc *Desc_local;
  
  FmtAttribs = (TextureFormatAttribs *)pDevice;
  pDevice_local = (IRenderDevice *)Desc;
  AdapterInfo = (GraphicsAdapterInfo *)GetTextureFormatAttribs(Desc->Format);
  DeviceInfo = (RenderDeviceInfo *)(**(code **)(FmtAttribs->Name + 200))();
  local_58 = (RenderDeviceInfo *)(**(code **)(FmtAttribs->Name + 0xc0))();
  if (*(char *)&pDevice_local[1].super_IObject._vptr_IObject == '\0') {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_320 = (_func_int **)0xe30c4c;
    }
    else {
      local_320 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_60 = local_320;
    in_stack_fffffffffffffa58 = "\': ";
    LogError<true,char[10],char_const*,char[4],char[33]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x39,(char (*) [10])0xf4cd7e,(char **)&local_60,(char (*) [4])"\': ",
               (char (*) [33])"Resource dimension is undefined.");
  }
  if ((*(byte *)&pDevice_local[1].super_IObject._vptr_IObject < 2) ||
     (8 < *(byte *)&pDevice_local[1].super_IObject._vptr_IObject)) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_328 = (_func_int **)0xe30c4c;
    }
    else {
      local_328 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_68 = local_328;
    in_stack_fffffffffffffa58 = "\': ";
    LogError<true,char[10],char_const*,char[4],char[31]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x3e,(char (*) [10])0xf4cd7e,(char **)&local_68,(char (*) [4])"\': ",
               (char (*) [31])"Unexpected resource dimension.");
  }
  if (*(int *)((long)&pDevice_local[1].super_IObject._vptr_IObject + 4) == 0) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_330 = (_func_int **)0xe30c4c;
    }
    else {
      local_330 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_70 = local_330;
    in_stack_fffffffffffffa58 = "\': ";
    LogError<true,char[10],char_const*,char[4],char[30]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x43,(char (*) [10])0xf4cd7e,(char **)&local_70,(char (*) [4])"\': ",
               (char (*) [30])"Texture width cannot be zero.");
  }
  if ((*(char *)&pDevice_local[1].super_IObject._vptr_IObject == '\x02') ||
     (*(char *)&pDevice_local[1].super_IObject._vptr_IObject == '\x03')) {
    if (*(uint *)&pDevice_local[2].super_IObject._vptr_IObject !=
        (uint)(byte)AdapterInfo->Description[0xf]) {
      if (AdapterInfo->Description[0xf] == '\x01') {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_338 = (_func_int **)0xe30c4c;
        }
        else {
          local_338 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        local_78 = local_338;
        in_stack_fffffffffffffa58 = "\': ";
        LogError<true,char[10],char_const*,char[4],char[9],unsigned_int,char[46]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x4d,(char (*) [10])0xf4cd7e,(char **)&local_78,(char (*) [4])"\': ",
                   (char (*) [9])"Height (",(uint *)(pDevice_local + 2),
                   (char (*) [46])") of a Texture 1D/Texture 1D Array must be 1.");
      }
      else {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_340 = (_func_int **)0xe30c4c;
        }
        else {
          local_340 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        local_80 = local_340;
        local_84 = (uint)(byte)AdapterInfo->Description[0xf];
        in_stack_fffffffffffffa58 = "\': ";
        LogError<true,char[10],char_const*,char[4],char[43],unsigned_int,char[82],unsigned_int,char[3]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x53,(char (*) [10])0xf4cd7e,(char **)&local_80,(char (*) [4])"\': ",
                   (char (*) [43])"For block-compressed formats, the height (",
                   (uint *)(pDevice_local + 2),
                   (char (*) [82])
                   ") of a Texture 1D/Texture 1D Array must be equal to the compressed block height ("
                   ,&local_84,(char (*) [3])0xf65ced);
      }
    }
  }
  else if (*(int *)&pDevice_local[2].super_IObject._vptr_IObject == 0) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_348 = (_func_int **)0xe30c4c;
    }
    else {
      local_348 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_90 = local_348;
    in_stack_fffffffffffffa58 = "\': ";
    LogError<true,char[10],char_const*,char[4],char[31]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x5a,(char (*) [10])0xf4cd7e,(char **)&local_90,(char (*) [4])"\': ",
               (char (*) [31])"Texture height cannot be zero.");
  }
  if ((*(char *)&pDevice_local[1].super_IObject._vptr_IObject == '\x06') &&
     (*(int *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 4) == 0)) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_350 = (_func_int **)0xe30c4c;
    }
    else {
      local_350 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_98 = local_350;
    in_stack_fffffffffffffa58 = "\': ";
    LogError<true,char[10],char_const*,char[4],char[33]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x5f,(char (*) [10])0xf4cd7e,(char **)&local_98,(char (*) [4])"\': ",
               (char (*) [33])"3D texture depth cannot be zero.");
  }
  if (((*(char *)&pDevice_local[1].super_IObject._vptr_IObject == '\x02') ||
      (*(char *)&pDevice_local[1].super_IObject._vptr_IObject == '\x04')) &&
     (*(int *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 4) != 1)) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_358 = (_func_int **)0xe30c4c;
    }
    else {
      local_358 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_a0 = local_358;
    in_stack_fffffffffffffa58 = "\': ";
    LogError<true,char[10],char_const*,char[4],char[42],unsigned_int,char[69]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x65,(char (*) [10])0xf4cd7e,(char **)&local_a0,(char (*) [4])"\': ",
               (char (*) [42])"Texture 1D/2D must have one array slice (",
               (uint *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 4),
               (char (*) [69])" provided). Use Texture 1D/2D array if you need more than one slice."
              );
  }
  if ((*(char *)&pDevice_local[1].super_IObject._vptr_IObject == '\a') ||
     (*(char *)&pDevice_local[1].super_IObject._vptr_IObject == '\b')) {
    if (*(int *)((long)&pDevice_local[1].super_IObject._vptr_IObject + 4) !=
        *(int *)&pDevice_local[2].super_IObject._vptr_IObject) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_360 = (_func_int **)0xe30c4c;
      }
      else {
        local_360 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_a8 = local_360;
      in_stack_fffffffffffffa58 = "\': ";
      LogError<true,char[10],char_const*,char[4],char[39],unsigned_int,char[39],unsigned_int,char[12]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x6b,(char (*) [10])0xf4cd7e,(char **)&local_a8,(char (*) [4])"\': ",
                 (char (*) [39])"For cube map textures, texture width (",
                 (uint *)((long)&pDevice_local[1].super_IObject._vptr_IObject + 4),
                 (char (*) [39])" provided) must match texture height (",(uint *)(pDevice_local + 2)
                 ,(char (*) [12])" provided).");
    }
    if (*(uint *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 4) < 6) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_368 = (_func_int **)0xe30c4c;
      }
      else {
        local_368 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      pp_Stack_b0 = local_368;
      in_stack_fffffffffffffa58 = "\': ";
      LogError<true,char[10],char_const*,char[4],char[54],unsigned_int,char[12]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x6e,(char (*) [10])0xf4cd7e,(char **)&stack0xffffffffffffff50,
                 (char (*) [4])"\': ",
                 (char (*) [54])"Texture cube/cube array must have at least 6 slices (",
                 (uint *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 4),
                 (char (*) [12])" provided).");
    }
  }
  msg.field_2._12_4_ = 0;
  bVar2 = TextureDesc::Is1D((TextureDesc *)pDevice_local);
  if (bVar2) {
    msg.field_2._12_4_ = *(undefined4 *)((long)&pDevice_local[1].super_IObject._vptr_IObject + 4);
  }
  else {
    bVar2 = TextureDesc::Is2D((TextureDesc *)pDevice_local);
    if (bVar2) {
      puVar11 = std::max<unsigned_int>
                          ((uint *)((long)&pDevice_local[1].super_IObject._vptr_IObject + 4),
                           (uint *)(pDevice_local + 2));
      msg.field_2._12_4_ = *puVar11;
    }
    else {
      bVar2 = TextureDesc::Is3D((TextureDesc *)pDevice_local);
      if (bVar2) {
        puVar11 = std::max<unsigned_int>
                            ((uint *)((long)&pDevice_local[1].super_IObject._vptr_IObject + 4),
                             (uint *)(pDevice_local + 2));
        puVar11 = std::max<unsigned_int>
                            (puVar11,(uint *)((long)&pDevice_local[2].super_IObject._vptr_IObject +
                                             4));
        msg.field_2._12_4_ = *puVar11;
      }
    }
  }
  uVar17 = 1 << ((char)*(undefined4 *)((long)&pDevice_local[3].super_IObject._vptr_IObject + 4) - 1U
                & 0x1f);
  pIVar16 = (IRenderDevice *)(ulong)uVar17;
  if ((uint)msg.field_2._12_4_ < uVar17) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_370 = (_func_int **)0xe30c4c;
    }
    else {
      local_370 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_e0 = local_370;
    FormatString<char[10],char_const*,char[36],unsigned_int,char[3]>
              ((string *)local_d8,(Diligent *)0xf4cd7e,(char (*) [10])&local_e0,
               (char **)"\': Incorrect number of Mip levels (",
               (char (*) [36])((long)&pDevice_local[3].super_IObject._vptr_IObject + 4),
               (uint *)0xf65ced,(char (*) [3])in_stack_fffffffffffffa58);
    Message = (Char *)std::__cxx11::string::c_str();
    pIVar16 = (IRenderDevice *)0x7a;
    DebugAssertionFailed
              (Message,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x7a);
    std::__cxx11::string::~string((string *)local_d8);
  }
  if (1 < *(uint *)&pDevice_local[4].super_IObject._vptr_IObject) {
    bVar2 = IsPowerOfTwo<unsigned_int>(*(uint *)&pDevice_local[4].super_IObject._vptr_IObject);
    if (!bVar2) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_380 = (_func_int **)0xe30c4c;
      }
      else {
        local_380 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_f8[0] = local_380;
      pIVar16 = (IRenderDevice *)0x80;
      LogError<true,char[10],char_const*,char[4],char[41]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x80,(char (*) [10])0xf4cd7e,(char **)local_f8,(char (*) [4])"\': ",
                 (char (*) [41])"SampleCount must be a power-of-two value");
    }
    if ((*(char *)&pDevice_local[1].super_IObject._vptr_IObject != '\x04') &&
       (*(char *)&pDevice_local[1].super_IObject._vptr_IObject != '\x05')) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_388 = (_func_int **)0xe30c4c;
      }
      else {
        local_388 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_100 = local_388;
      pIVar16 = (IRenderDevice *)0x83;
      LogError<true,char[10],char_const*,char[4],char[53]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x83,(char (*) [10])0xf4cd7e,(char **)&local_100,(char (*) [4])"\': ",
                 (char (*) [53])"Only Texture 2D/Texture 2D Array can be multisampled");
    }
    if (*(int *)((long)&pDevice_local[3].super_IObject._vptr_IObject + 4) != 1) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_390 = (_func_int **)0xe30c4c;
      }
      else {
        local_390 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_108 = local_390;
      pIVar16 = (IRenderDevice *)0x86;
      LogError<true,char[10],char_const*,char[4],char[48],unsigned_int,char[20]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x86,(char (*) [10])0xf4cd7e,(char **)&local_108,(char (*) [4])"\': ",
                 (char (*) [48])"Multisampled textures must have one mip level (",
                 (uint *)((long)&pDevice_local[3].super_IObject._vptr_IObject + 4),
                 (char (*) [20])" levels specified).");
    }
    BVar7 = operator&(*(BIND_FLAGS *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4),
                      BIND_UNORDERED_ACCESS);
    if (BVar7 != BIND_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_398 = (_func_int **)0xe30c4c;
      }
      else {
        local_398 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      FmtName = (char *)local_398;
      pIVar16 = (IRenderDevice *)0x89;
      LogError<true,char[10],char_const*,char[4],char[48]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x89,(char (*) [10])0xf4cd7e,&FmtName,(char (*) [4])"\': ",
                 (char (*) [48])"UAVs are not allowed for multisampled resources");
    }
  }
  BVar7 = operator&(*(BIND_FLAGS *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4),
                    BIND_RENDER_TARGET);
  if ((BVar7 != BIND_NONE) &&
     (((((*(short *)&pDevice_local[3].super_IObject._vptr_IObject == 0x3f ||
         (*(short *)&pDevice_local[3].super_IObject._vptr_IObject == 0x33)) ||
        (*(short *)&pDevice_local[3].super_IObject._vptr_IObject == 0x1f)) ||
       ((*(short *)&pDevice_local[3].super_IObject._vptr_IObject == 0x3a ||
        (*(short *)&pDevice_local[3].super_IObject._vptr_IObject == 0x25)))) ||
      (*(short *)&pDevice_local[3].super_IObject._vptr_IObject == 0xd)))) {
    pTVar12 = GetTextureFormatAttribs
                        (*(TEXTURE_FORMAT *)&pDevice_local[3].super_IObject._vptr_IObject);
    _msg.field_2._8_8_ = pTVar12->Name;
    FormatString<char_const*,char[216]>
              ((string *)&MemInfo,(Diligent *)(_msg.field_2._M_local_buf + 8),
               (char **)
               " texture is created with BIND_RENDER_TARGET flag set.\nThere might be an issue in OpenGL driver on NVidia hardware: when rendering to SNORM textures, all negative values are clamped to zero.\nUse UNORM format instead."
               ,(char (*) [216])pIVar16);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar13 = std::__cxx11::string::c_str();
      pIVar16 = (IRenderDevice *)0x0;
      (*(code *)puVar1)(1,uVar13,0);
    }
    std::__cxx11::string::~string((string *)&MemInfo);
  }
  MVar3 = operator&(*(MISC_TEXTURE_FLAGS *)((long)&pDevice_local[5].super_IObject._vptr_IObject + 2)
                    ,MISC_TEXTURE_FLAG_MEMORYLESS);
  if (MVar3 != MISC_TEXTURE_FLAG_NONE) {
    local_140 = &DeviceInfo[1].Features.ShaderInputOutput16;
    if (DeviceInfo[1].MaxShaderVersion.HLSL.Minor == 0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_3a8 = (_func_int **)0xe30c4c;
      }
      else {
        local_3a8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_148 = local_3a8;
      LogError<true,char[10],char_const*,char[4],char[48]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x9b,(char (*) [10])0xf4cd7e,(char **)&local_148,(char (*) [4])"\': ",
                 (char (*) [48])"Memoryless textures are not supported by device");
    }
    BVar7 = *(BIND_FLAGS *)(local_140 + 0x24);
    BVar8 = operator&(*(BIND_FLAGS *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4),BVar7
                     );
    pIVar16 = pDevice_local;
    if (BVar8 != *(BIND_FLAGS *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_3b0 = (_func_int **)0xe30c4c;
      }
      else {
        local_3b0 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_150 = local_3b0;
      BVar8 = *(BIND_FLAGS *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4);
      BVar7 = operator~((Diligent *)(ulong)*(uint *)(local_140 + 0x24),BVar7);
      BVar7 = operator&(BVar8,BVar7);
      GetBindFlagsString_abi_cxx11_(&local_170,(Diligent *)(ulong)BVar7,0xed5645,(char *)pIVar16);
      pIVar16 = (IRenderDevice *)0x9e;
      LogError<true,char[10],char_const*,char[4],char[11],std::__cxx11::string,char[44]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x9e,(char (*) [10])0xf4cd7e,(char **)&local_150,(char (*) [4])"\': ",
                 (char (*) [11])"BindFlags ",&local_170,
                 (char (*) [44])" are not supported for memoryless textures.");
      std::__cxx11::string::~string((string *)&local_170);
    }
    if (*(char *)&pDevice_local[5].super_IObject._vptr_IObject != '\x01') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_3c8 = (_func_int **)0xe30c4c;
      }
      else {
        local_3c8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_178 = local_3c8;
      pIVar16 = (IRenderDevice *)0xa1;
      LogError<true,char[10],char_const*,char[4],char[46]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xa1,(char (*) [10])0xf4cd7e,(char **)&local_178,(char (*) [4])"\': ",
                 (char (*) [46])"Memoryless attachment requires USAGE_DEFAULT.");
    }
    if (*(char *)((long)&pDevice_local[5].super_IObject._vptr_IObject + 1) != '\0') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_3d0 = (_func_int **)0xe30c4c;
      }
      else {
        local_3d0 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_180 = local_3d0;
      pIVar16 = (IRenderDevice *)0xa4;
      LogError<true,char[10],char_const*,char[4],char[58]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xa4,(char (*) [10])0xf4cd7e,(char **)&local_180,(char (*) [4])"\': ",
                 (char (*) [58])"Memoryless attachment requires CPUAccessFlags to be NONE.");
    }
    MVar3 = operator&(*(MISC_TEXTURE_FLAGS *)
                       ((long)&pDevice_local[5].super_IObject._vptr_IObject + 2),
                      MISC_TEXTURE_FLAG_GENERATE_MIPS);
    if (MVar3 != MISC_TEXTURE_FLAG_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_3d8 = (_func_int **)0xe30c4c;
      }
      else {
        local_3d8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_188 = local_3d8;
      pIVar16 = (IRenderDevice *)0xa7;
      LogError<true,char[10],char_const*,char[4],char[64]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xa7,(char (*) [10])0xf4cd7e,(char **)&local_188,(char (*) [4])"\': ",
                 (char (*) [64])"Memoryless attachment is not compatible with mipmap generation.");
    }
  }
  if (*(char *)&pDevice_local[5].super_IObject._vptr_IObject == '\x03') {
    if (*(int *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4) != 0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_3e0 = (_func_int **)0xe30c4c;
      }
      else {
        local_3e0 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_190 = local_3e0;
      LogError<true,char[10],char_const*,char[4],char[60]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xad,(char (*) [10])0xf4cd7e,(char **)&local_190,(char (*) [4])"\': ",
                 (char (*) [60])"Staging textures cannot be bound to any GPU pipeline stage.");
    }
    MVar3 = operator&(*(MISC_TEXTURE_FLAGS *)
                       ((long)&pDevice_local[5].super_IObject._vptr_IObject + 2),
                      MISC_TEXTURE_FLAG_GENERATE_MIPS);
    if (MVar3 != MISC_TEXTURE_FLAG_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_3e8 = (_func_int **)0xe30c4c;
      }
      else {
        local_3e8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_198 = local_3e8;
      LogError<true,char[10],char_const*,char[4],char[54]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xb0,(char (*) [10])0xf4cd7e,(char **)&local_198,(char (*) [4])"\': ",
                 (char (*) [54])"Mipmaps cannot be autogenerated for staging textures.");
    }
    if (*(char *)((long)&pDevice_local[5].super_IObject._vptr_IObject + 1) == '\0') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_3f0 = (_func_int **)0xe30c4c;
      }
      else {
        local_3f0 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_1a0 = local_3f0;
      LogError<true,char[10],char_const*,char[4],char[48]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xb3,(char (*) [10])0xf4cd7e,(char **)&local_1a0,(char (*) [4])"\': ",
                 (char (*) [48])"Staging textures must specify CPU access flags.");
    }
    CVar5 = *(CPU_ACCESS_FLAGS *)((long)&pDevice_local[5].super_IObject._vptr_IObject + 1);
    CVar4 = operator|(CPU_ACCESS_READ,CPU_ACCESS_FLAG_LAST);
    CVar5 = operator&(CVar5,CVar4);
    CVar4 = operator|(CPU_ACCESS_READ,CPU_ACCESS_FLAG_LAST);
    pIVar16 = (IRenderDevice *)(ulong)CVar4;
    if (CVar5 == CVar4) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_400 = (_func_int **)0xe30c4c;
      }
      else {
        local_400 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_1a8 = local_400;
      pIVar16 = (IRenderDevice *)0xb6;
      LogError<true,char[10],char_const*,char[4],char[76]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xb6,(char (*) [10])0xf4cd7e,(char **)&local_1a8,(char (*) [4])"\': ",
                 (char (*) [76])
                 "Staging textures must use exactly one of ACCESS_READ or ACCESS_WRITE flags.");
    }
  }
  else if (*(char *)&pDevice_local[5].super_IObject._vptr_IObject == '\x04') {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_408 = (_func_int **)0xe30c4c;
    }
    else {
      local_408 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_1b0 = local_408;
    pIVar16 = (IRenderDevice *)0xba;
    LogError<true,char[10],char_const*,char[4],char[52]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0xba,(char (*) [10])0xf4cd7e,(char **)&local_1b0,(char (*) [4])"\': ",
               (char (*) [52])"USAGE_UNIFIED textures are currently not supported.");
  }
  if ((*(char *)&pDevice_local[5].super_IObject._vptr_IObject == '\x02') &&
     (UVar9 = LinuxMisc::CountOneBits((Uint64)pDevice_local[9].super_IObject._vptr_IObject),
     1 < UVar9)) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_410 = (ShadingRateProperties *)0xe30c4c;
    }
    else {
      local_410 = (ShadingRateProperties *)(pDevice_local->super_IObject)._vptr_IObject;
    }
    SRProps = local_410;
    pIVar16 = (IRenderDevice *)0xc2;
    LogError<true,char[10],char_const*,char[4],char[73]>
              (false,"ValidateTextureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0xc2,(char (*) [10])0xf4cd7e,(char **)&SRProps,(char (*) [4])"\': ",
               (char (*) [73])
               "USAGE_DYNAMIC textures may only be used in one immediate device context.");
  }
  local_1c0 = (**(code **)(FmtAttribs->Name + 200))();
  local_1c0 = local_1c0 + 0x140;
  MVar3 = operator&(*(MISC_TEXTURE_FLAGS *)((long)&pDevice_local[5].super_IObject._vptr_IObject + 2)
                    ,MISC_TEXTURE_FLAG_SUBSAMPLED);
  if (MVar3 != MISC_TEXTURE_FLAG_NONE) {
    lVar14 = (**(code **)(FmtAttribs->Name + 0xc0))();
    if (*(char *)(lVar14 + 0x33) == '\0') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_418 = (_func_int **)0xe30c4c;
      }
      else {
        local_418 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_1c8 = local_418;
      pIVar16 = (IRenderDevice *)0xc9;
      LogError<true,char[10],char_const*,char[4],char[67]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xc9,(char (*) [10])0xf4cd7e,(char **)&local_1c8,(char (*) [4])"\': ",
                 (char (*) [67])"MISC_TEXTURE_FLAG_SUBSAMPLED requires VariableRateShading feature."
                );
    }
    pRVar15 = (RenderDeviceInfo *)(**(code **)(FmtAttribs->Name + 0xc0))();
    bVar2 = RenderDeviceInfo::IsMetalDevice(pRVar15);
    if (bVar2) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_420 = (_func_int **)0xe30c4c;
      }
      else {
        local_420 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_1d0 = local_420;
      pIVar16 = (IRenderDevice *)0xcc;
      LogError<true,char[10],char_const*,char[4],char[111]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xcc,(char (*) [10])0xf4cd7e,(char **)&local_1d0,(char (*) [4])"\': ",
                 (char (*) [111])
                 "MISC_TEXTURE_FLAG_SUBSAMPLED is not supported in Metal, use IRasterizationRateMapMtl to implement VRS in Metal"
                );
    }
    SVar6 = operator&(*(SHADING_RATE_CAP_FLAGS *)(local_1c0 + 0x14),
                      SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET);
    if (SVar6 == SHADING_RATE_CAP_FLAG_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_428 = (_func_int **)0xe30c4c;
      }
      else {
        local_428 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_1d8 = local_428;
      pIVar16 = (IRenderDevice *)0xcf;
      LogError<true,char[10],char_const*,char[4],char[97]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xcf,(char (*) [10])0xf4cd7e,(char **)&local_1d8,(char (*) [4])"\': ",
                 (char (*) [97])
                 "MISC_TEXTURE_FLAG_SUBSAMPLED requires SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET capability."
                );
    }
    BVar7 = *(BIND_FLAGS *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4);
    BVar8 = operator|(BIND_RENDER_TARGET,BIND_DEPTH_STENCIL);
    BVar7 = operator&(BVar7,BVar8);
    if (BVar7 == BIND_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_438 = (_func_int **)0xe30c4c;
      }
      else {
        local_438 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_1e0 = local_438;
      pIVar16 = (IRenderDevice *)0xd2;
      LogError<true,char[10],char_const*,char[4],char[87]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xd2,(char (*) [10])0xf4cd7e,(char **)&local_1e0,(char (*) [4])"\': ",
                 (char (*) [87])
                 "Subsampled texture must use one of BIND_RENDER_TARGET or BIND_DEPTH_STENCIL bind flags"
                );
    }
    BVar7 = operator&(*(BIND_FLAGS *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4),
                      BIND_FLAG_LAST);
    if (BVar7 != BIND_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_440 = (_func_int **)0xe30c4c;
      }
      else {
        local_440 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_1e8 = local_440;
      pIVar16 = (IRenderDevice *)0xd5;
      LogError<true,char[10],char_const*,char[4],char[70]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xd5,(char (*) [10])0xf4cd7e,(char **)&local_1e8,(char (*) [4])"\': ",
                 (char (*) [70])
                 "MISC_TEXTURE_FLAG_SUBSAMPLED is not compatible with BIND_SHADING_RATE");
    }
  }
  BVar7 = operator&(*(BIND_FLAGS *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4),
                    BIND_FLAG_LAST);
  if (BVar7 != BIND_NONE) {
    lVar14 = (**(code **)(FmtAttribs->Name + 0xc0))();
    if (*(char *)(lVar14 + 0x33) == '\0') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_448 = (_func_int **)0xe30c4c;
      }
      else {
        local_448 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_1f0 = local_448;
      pIVar16 = (IRenderDevice *)0xdb;
      LogError<true,char[10],char_const*,char[4],char[56]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xdb,(char (*) [10])0xf4cd7e,(char **)&local_1f0,(char (*) [4])"\': ",
                 (char (*) [56])"BIND_SHADING_RATE requires VariableRateShading feature.");
    }
    pRVar15 = (RenderDeviceInfo *)(**(code **)(FmtAttribs->Name + 0xc0))();
    bVar2 = RenderDeviceInfo::IsMetalDevice(pRVar15);
    if (bVar2) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_450 = (_func_int **)0xe30c4c;
      }
      else {
        local_450 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_1f8 = local_450;
      pIVar16 = (IRenderDevice *)0xde;
      LogError<true,char[10],char_const*,char[4],char[83]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xde,(char (*) [10])0xf4cd7e,(char **)&local_1f8,(char (*) [4])"\': ",
                 (char (*) [83])
                 "BIND_SHADING_RATE is not supported in Metal, use IRasterizationRateMapMtl instead."
                );
    }
    bVar2 = RenderDeviceInfo::IsMetalDevice(local_58);
    if (bVar2) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_458 = (_func_int **)0xe30c4c;
      }
      else {
        local_458 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_200 = local_458;
      pIVar16 = (IRenderDevice *)0xe1;
      LogError<true,char[10],char_const*,char[4],char[88]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xe1,(char (*) [10])0xf4cd7e,(char **)&local_200,(char (*) [4])"\': ",
                 (char (*) [88])
                 "BIND_FLAG_SHADING_RATE is not supported in Metal, use IRasterizationRateMapMtl instead."
                );
    }
    BVar7 = BIND_UNIFORM_BUFFER;
    SVar6 = operator&(*(SHADING_RATE_CAP_FLAGS *)(local_1c0 + 0x14),
                      SHADING_RATE_CAP_FLAG_TEXTURE_BASED);
    if (SVar6 == SHADING_RATE_CAP_FLAG_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_460 = (_func_int **)0xe30c4c;
      }
      else {
        local_460 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_208 = local_460;
      BVar7 = 0xf55970;
      pIVar16 = (IRenderDevice *)0xe4;
      LogError<true,char[10],char_const*,char[4],char[75]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xe4,(char (*) [10])0xf4cd7e,(char **)&local_208,(char (*) [4])"\': ",
                 (char (*) [75])
                 "BIND_SHADING_RATE requires SHADING_RATE_CAP_FLAG_TEXTURE_BASED capability.");
    }
    if (*(int *)&pDevice_local[4].super_IObject._vptr_IObject != 1) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_468 = (_func_int **)0xe30c4c;
      }
      else {
        local_468 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_210 = local_468;
      BVar7 = 0xf55970;
      pIVar16 = (IRenderDevice *)0xe7;
      LogError<true,char[10],char_const*,char[4],char[58]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xe7,(char (*) [10])0xf4cd7e,(char **)&local_210,(char (*) [4])"\': ",
                 (char (*) [58])"BIND_SHADING_RATE is not allowed for multisample texture.");
    }
    if ((*(char *)&pDevice_local[1].super_IObject._vptr_IObject == '\x05') &&
       (1 < *(uint *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 4))) {
      BVar7 = BIND_INDIRECT_DRAW_ARGS;
      SVar6 = operator&(*(SHADING_RATE_CAP_FLAGS *)(local_1c0 + 0x14),
                        SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY);
      if (SVar6 == SHADING_RATE_CAP_FLAG_NONE) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_470 = (_func_int **)0xe30c4c;
        }
        else {
          local_470 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        local_218 = local_470;
        BVar7 = 0xf55970;
        pIVar16 = (IRenderDevice *)0xea;
        LogError<true,char[10],char_const*,char[4],char[83]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0xea,(char (*) [10])0xf4cd7e,(char **)&local_218,(char (*) [4])"\': ",
                   (char (*) [83])
                   "Shading rate texture arrays require SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY capability"
                  );
      }
    }
    if ((*(char *)&pDevice_local[5].super_IObject._vptr_IObject != '\x01') &&
       (*(char *)&pDevice_local[5].super_IObject._vptr_IObject != '\0')) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_478 = (_func_int **)0xe30c4c;
      }
      else {
        local_478 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_220 = local_478;
      BVar7 = 0xf55970;
      pIVar16 = (IRenderDevice *)0xed;
      LogError<true,char[10],char_const*,char[4],char[67]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xed,(char (*) [10])0xf4cd7e,(char **)&local_220,(char (*) [4])"\': ",
                 (char (*) [67])"Shading rate textures only allow USAGE_DEFAULT or USAGE_IMMUTABLE."
                );
    }
    if (*(int *)((long)&pDevice_local[3].super_IObject._vptr_IObject + 4) != 1) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_480 = (_func_int **)0xe30c4c;
      }
      else {
        local_480 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_228 = local_480;
      BVar7 = 0xf55970;
      pIVar16 = (IRenderDevice *)0xf1;
      LogError<true,char[10],char_const*,char[4],char[44]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xf1,(char (*) [10])0xf4cd7e,(char **)&local_228,(char (*) [4])"\': ",
                 (char (*) [44])"Shading rate texture must have 1 mip level.");
    }
    BVar8 = *(BIND_FLAGS *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4);
    BVar7 = operator~((Diligent *)(ulong)*(uint *)(local_1c0 + 0x1c),BVar7);
    BVar8 = operator&(BVar8,BVar7);
    if (BVar8 != BIND_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_490 = (_func_int **)0xe30c4c;
      }
      else {
        local_490 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_230 = local_490;
      BVar8 = *(BIND_FLAGS *)((long)&pDevice_local[4].super_IObject._vptr_IObject + 4);
      BVar7 = operator~((Diligent *)(ulong)*(uint *)(local_1c0 + 0x1c),BVar7);
      BVar7 = operator&(BVar8,BVar7);
      GetBindFlagsString_abi_cxx11_(&local_250,(Diligent *)(ulong)BVar7,0xf64f1c,(char *)pIVar16);
      local_251 = '.';
      LogError<true,char[10],char_const*,char[4],char[70],std::__cxx11::string,char>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xf4,(char (*) [10])0xf4cd7e,(char **)&local_230,(char (*) [4])"\': ",
                 (char (*) [70])
                 "the following bind flags are not allowed for a shading rate texture: ",&local_250,
                 &local_251);
      std::__cxx11::string::~string((string *)&local_250);
    }
    if ((*(char *)&pDevice_local[1].super_IObject._vptr_IObject != '\x04') &&
       ((*(char *)&pDevice_local[1].super_IObject._vptr_IObject != '\x05' ||
        (SVar6 = operator&(*(SHADING_RATE_CAP_FLAGS *)(local_1c0 + 0x14),
                           SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY), SVar6 == SHADING_RATE_CAP_FLAG_NONE
        )))) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_4a8 = (_func_int **)0xe30c4c;
      }
      else {
        local_4a8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_260 = local_4a8;
      LogError<true,char[10],char_const*,char[4],char[97]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0xf8,(char (*) [10])0xf4cd7e,(char **)&local_260,(char (*) [4])"\': ",
                 (char (*) [97])
                 "Shading rate texture must be 2D or 2D Array with SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY capability."
                );
    }
    if (*(char *)(local_1c0 + 0x17) == '\x01') {
      if (*(short *)&pDevice_local[3].super_IObject._vptr_IObject != 0x3e) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_4b8 = (_func_int **)0xe30c4c;
        }
        else {
          local_4b8 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        local_268 = local_4b8;
        LogError<true,char[10],char_const*,char[4],char[45]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0xfe,(char (*) [10])0xf4cd7e,(char **)&local_268,(char (*) [4])"\': ",
                   (char (*) [45])"Shading rate texture format must be R8_UINT.");
      }
    }
    else if (*(char *)(local_1c0 + 0x17) == '\x02') {
      if (*(short *)&pDevice_local[3].super_IObject._vptr_IObject != 0x31) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_4c0 = (_func_int **)0xe30c4c;
        }
        else {
          local_4c0 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        local_270 = local_4c0;
        LogError<true,char[10],char_const*,char[4],char[47]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x103,(char (*) [10])0xf4cd7e,(char **)&local_270,(char (*) [4])"\': ",
                   (char (*) [47])"Shading rate texture format must be RG8_UNORM.");
      }
    }
    else {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_4c8 = (_func_int **)0xe30c4c;
      }
      else {
        local_4c8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_278 = local_4c8;
      LogError<true,char[10],char_const*,char[4],char[39]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x108,(char (*) [10])0xf4cd7e,(char **)&local_278,(char (*) [4])"\': ",
                 (char (*) [39])"Shading rate texture is not supported.");
    }
  }
  if (*(char *)&pDevice_local[5].super_IObject._vptr_IObject == '\x05') {
    if ((local_58->Features).SparseResources == DEVICE_FEATURE_STATE_DISABLED) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_4d0 = (SparseResourceProperties *)0xe30c4c;
      }
      else {
        local_4d0 = (SparseResourceProperties *)(pDevice_local->super_IObject)._vptr_IObject;
      }
      SparseRes = local_4d0;
      LogError<true,char[10],char_const*,char[4],char[48]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x10e,(char (*) [10])0xf4cd7e,(char **)&SparseRes,(char (*) [4])"\': ",
                 (char (*) [48])"sparse texture requires SparseResources feature");
    }
    local_288 = DeviceInfo + 4;
    MVar3 = operator&(*(MISC_TEXTURE_FLAGS *)
                       ((long)&pDevice_local[5].super_IObject._vptr_IObject + 2),
                      MISC_TEXTURE_FLAG_SPARSE_ALIASING);
    if ((MVar3 != MISC_TEXTURE_FLAG_NONE) &&
       (SVar10._0_1_ = (local_288->Features).ComputeShaders,
       SVar10._1_1_ = (local_288->Features).GeometryShaders,
       SVar10._2_1_ = (local_288->Features).Tessellation,
       SVar10._3_1_ = (local_288->Features).MeshShaders,
       SVar10 = operator&(SVar10,SPARSE_RESOURCE_CAP_FLAG_ALIASED),
       SVar10 == SPARSE_RESOURCE_CAP_FLAG_NONE)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_4d8 = (_func_int **)0xe30c4c;
      }
      else {
        local_4d8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_290 = local_4d8;
      LogError<true,char[10],char_const*,char[4],char[92]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x113,(char (*) [10])0xf4cd7e,(char **)&local_290,(char (*) [4])"\': ",
                 (char (*) [92])
                 "MISC_TEXTURE_FLAG_SPARSE_ALIASING flag requires SPARSE_RESOURCE_CAP_FLAG_ALIASED capability"
                );
    }
    switch(*(undefined1 *)&pDevice_local[1].super_IObject._vptr_IObject) {
    case 2:
    case 3:
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_530 = (_func_int **)0xe30c4c;
      }
      else {
        local_530 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_308 = local_530;
      LogError<true,char[10],char_const*,char[4],char[37]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x136,(char (*) [10])0xf4cd7e,(char **)&local_308,(char (*) [4])"\': ",
                 (char (*) [37])"Sparse 1D textures are not supported");
      break;
    case 4:
      a._0_1_ = (local_288->Features).ComputeShaders;
      a._1_1_ = (local_288->Features).GeometryShaders;
      a._2_1_ = (local_288->Features).Tessellation;
      a._3_1_ = (local_288->Features).MeshShaders;
      SVar10 = operator&(a,SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D);
      if (SVar10 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_4e8 = (_func_int **)0xe30c4c;
        }
        else {
          local_4e8 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        local_298 = local_4e8;
        LogError<true,char[10],char_const*,char[4],char[67]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x11a,(char (*) [10])0xf4cd7e,(char **)&local_298,(char (*) [4])"\': ",
                   (char (*) [67])
                   "2D texture requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability");
      }
      break;
    case 5:
    case 7:
    case 8:
      a_00._0_1_ = (local_288->Features).ComputeShaders;
      a_00._1_1_ = (local_288->Features).GeometryShaders;
      a_00._2_1_ = (local_288->Features).Tessellation;
      a_00._3_1_ = (local_288->Features).MeshShaders;
      SVar10 = operator&(a_00,SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D);
      if (SVar10 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_4f0 = (_func_int **)0xe30c4c;
        }
        else {
          local_4f0 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        Props._48_8_ = local_4f0;
        LogError<true,char[10],char_const*,char[4],char[89]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x121,(char (*) [10])0xf4cd7e,(char **)&Props.BlockSize,(char (*) [4])"\': ",
                   (char (*) [89])
                   "2D array or Cube sparse textures requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability"
                  );
      }
      a_01._0_1_ = (local_288->Features).ComputeShaders;
      a_01._1_1_ = (local_288->Features).GeometryShaders;
      a_01._2_1_ = (local_288->Features).Tessellation;
      a_01._3_1_ = (local_288->Features).MeshShaders;
      SVar10 = operator&(a_01,SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL);
      if (SVar10 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
        GetStandardSparseTextureProperties
                  ((SparseTextureProperties *)&MipSize,(TextureDesc *)pDevice_local);
        local_2e4 = 1;
        local_2f0[2] = *(uint *)((long)&pDevice_local[1].super_IObject._vptr_IObject + 4) >>
                       ((byte)*(undefined4 *)
                               ((long)&pDevice_local[3].super_IObject._vptr_IObject + 4) & 0x1f);
        puVar11 = std::max<unsigned_int>(&local_2e4,local_2f0 + 2);
        uVar17 = *puVar11;
        local_2f0[1] = 1;
        local_2f0[0] = *(uint *)&pDevice_local[2].super_IObject._vptr_IObject >>
                       ((byte)*(undefined4 *)
                               ((long)&pDevice_local[3].super_IObject._vptr_IObject + 4) & 0x1f);
        puVar11 = std::max<unsigned_int>(local_2f0 + 1,local_2f0);
        Vector2<unsigned_int>::Vector2((Vector2<unsigned_int> *)&local_2e0.field_0,uVar17,*puVar11);
        if ((local_2e0.field_0.x < Props.MipTailSize._4_4_) ||
           (local_2e0.field_0.y < Props.FirstMipInTail)) {
          if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
            local_500 = (_func_int **)0xe30c4c;
          }
          else {
            local_500 = (pDevice_local->super_IObject)._vptr_IObject;
          }
          local_2f8 = local_500;
          LogError<true,char[10],char_const*,char[4],char[54],unsigned_int,char[38],unsigned_int,char[2],unsigned_int,char[31],unsigned_int,char[2],unsigned_int,char[73]>
                    (false,"ValidateTextureDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                     ,299,(char (*) [10])0xf4cd7e,(char **)&local_2f8,(char (*) [4])"\': ",
                     (char (*) [54])"2D array or Cube sparse texture with mip level count ",
                     (uint *)((long)&pDevice_local[3].super_IObject._vptr_IObject + 4),
                     (char (*) [38])", where the last mip with dimension (",(uint *)&local_2e0,
                     (char (*) [2])0xf64b78,&local_2e0.field_0.y,
                     (char (*) [31])") is less than the tile size (",
                     (uint *)((long)&Props.MipTailSize + 4),(char (*) [2])0xf64b78,
                     &Props.FirstMipInTail,
                     (char (*) [73])
                     ") requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL capability");
        }
      }
      break;
    case 6:
      a_02._0_1_ = (local_288->Features).ComputeShaders;
      a_02._1_1_ = (local_288->Features).GeometryShaders;
      a_02._2_1_ = (local_288->Features).Tessellation;
      a_02._3_1_ = (local_288->Features).MeshShaders;
      SVar10 = operator&(a_02,SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D);
      if (SVar10 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_528 = (_func_int **)0xe30c4c;
        }
        else {
          local_528 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        local_300 = local_528;
        LogError<true,char[10],char_const*,char[4],char[74]>
                  (false,"ValidateTextureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x131,(char (*) [10])0xf4cd7e,(char **)&local_300,(char (*) [4])"\': ",
                   (char (*) [74])
                   "3D sparse texture requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D capability");
      }
      break;
    default:
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_538 = (_func_int **)0xe30c4c;
      }
      else {
        local_538 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_310 = local_538;
      LogError<true,char[10],char_const*,char[4],char[21]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x13a,(char (*) [10])0xf4cd7e,(char **)&local_310,(char (*) [4])"\': ",
                 (char (*) [21])"unknown texture type");
    }
  }
  else {
    MVar3 = operator&(*(MISC_TEXTURE_FLAGS *)
                       ((long)&pDevice_local[5].super_IObject._vptr_IObject + 2),
                      MISC_TEXTURE_FLAG_SPARSE_ALIASING);
    if (MVar3 != MISC_TEXTURE_FLAG_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_540 = (_func_int **)0xe30c4c;
      }
      else {
        local_540 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_318 = local_540;
      LogError<true,char[10],char_const*,char[4],char[87]>
                (false,"ValidateTextureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x140,(char (*) [10])0xf4cd7e,(char **)&local_318,(char (*) [4])"\': ",
                 (char (*) [87])
                 "MiscFlags must not have MISC_TEXTURE_FLAG_SPARSE_ALIASING if usage is not USAGE_SPARSE"
                );
    }
  }
  return;
}

Assistant:

void ValidateTextureDesc(const TextureDesc& Desc, const IRenderDevice* pDevice) noexcept(false)
{
    const TextureFormatAttribs& FmtAttribs  = GetTextureFormatAttribs(Desc.Format);
    const GraphicsAdapterInfo&  AdapterInfo = pDevice->GetAdapterInfo();
    const RenderDeviceInfo&     DeviceInfo  = pDevice->GetDeviceInfo();

    if (Desc.Type == RESOURCE_DIM_UNDEFINED)
    {
        LOG_TEXTURE_ERROR_AND_THROW("Resource dimension is undefined.");
    }

    if (!(Desc.Type >= RESOURCE_DIM_TEX_1D && Desc.Type <= RESOURCE_DIM_TEX_CUBE_ARRAY))
    {
        LOG_TEXTURE_ERROR_AND_THROW("Unexpected resource dimension.");
    }

    if (Desc.Width == 0)
    {
        LOG_TEXTURE_ERROR_AND_THROW("Texture width cannot be zero.");
    }

    // Perform some parameter correctness check
    if (Desc.Type == RESOURCE_DIM_TEX_1D || Desc.Type == RESOURCE_DIM_TEX_1D_ARRAY)
    {
        if (Desc.Height != FmtAttribs.BlockHeight)
        {
            if (FmtAttribs.BlockHeight == 1)
            {
                LOG_TEXTURE_ERROR_AND_THROW("Height (", Desc.Height, ") of a Texture 1D/Texture 1D Array must be 1.");
            }
            else
            {
                LOG_TEXTURE_ERROR_AND_THROW("For block-compressed formats, the height (", Desc.Height,
                                            ") of a Texture 1D/Texture 1D Array must be equal to the compressed block height (",
                                            Uint32{FmtAttribs.BlockHeight}, ").");
            }
        }
    }
    else
    {
        if (Desc.Height == 0)
            LOG_TEXTURE_ERROR_AND_THROW("Texture height cannot be zero.");
    }

    if (Desc.Type == RESOURCE_DIM_TEX_3D && Desc.Depth == 0)
    {
        LOG_TEXTURE_ERROR_AND_THROW("3D texture depth cannot be zero.");
    }

    if (Desc.Type == RESOURCE_DIM_TEX_1D || Desc.Type == RESOURCE_DIM_TEX_2D)
    {
        if (Desc.ArraySize != 1)
            LOG_TEXTURE_ERROR_AND_THROW("Texture 1D/2D must have one array slice (", Desc.ArraySize, " provided). Use Texture 1D/2D array if you need more than one slice.");
    }

    if (Desc.Type == RESOURCE_DIM_TEX_CUBE || Desc.Type == RESOURCE_DIM_TEX_CUBE_ARRAY)
    {
        if (Desc.Width != Desc.Height)
            LOG_TEXTURE_ERROR_AND_THROW("For cube map textures, texture width (", Desc.Width, " provided) must match texture height (", Desc.Height, " provided).");

        if (Desc.ArraySize < 6)
            LOG_TEXTURE_ERROR_AND_THROW("Texture cube/cube array must have at least 6 slices (", Desc.ArraySize, " provided).");
    }

#ifdef DILIGENT_DEVELOPMENT
    {
        Uint32 MaxDim = 0;
        if (Desc.Is1D())
            MaxDim = Desc.Width;
        else if (Desc.Is2D())
            MaxDim = std::max(Desc.Width, Desc.Height);
        else if (Desc.Is3D())
            MaxDim = std::max(std::max(Desc.Width, Desc.Height), Desc.Depth);
        DEV_CHECK_ERR(MaxDim >= (1U << (Desc.MipLevels - 1)), "Texture '", Desc.Name ? Desc.Name : "", "': Incorrect number of Mip levels (", Desc.MipLevels, ").");
    }
#endif

    if (Desc.SampleCount > 1)
    {
        VERIFY_TEXTURE(IsPowerOfTwo(Desc.SampleCount), "SampleCount must be a power-of-two value");

        if (!(Desc.Type == RESOURCE_DIM_TEX_2D || Desc.Type == RESOURCE_DIM_TEX_2D_ARRAY))
            LOG_TEXTURE_ERROR_AND_THROW("Only Texture 2D/Texture 2D Array can be multisampled");

        if (Desc.MipLevels != 1)
            LOG_TEXTURE_ERROR_AND_THROW("Multisampled textures must have one mip level (", Desc.MipLevels, " levels specified).");

        if (Desc.BindFlags & BIND_UNORDERED_ACCESS)
            LOG_TEXTURE_ERROR_AND_THROW("UAVs are not allowed for multisampled resources");
    }

    if ((Desc.BindFlags & BIND_RENDER_TARGET) &&
        (Desc.Format == TEX_FORMAT_R8_SNORM || Desc.Format == TEX_FORMAT_RG8_SNORM || Desc.Format == TEX_FORMAT_RGBA8_SNORM ||
         Desc.Format == TEX_FORMAT_R16_SNORM || Desc.Format == TEX_FORMAT_RG16_SNORM || Desc.Format == TEX_FORMAT_RGBA16_SNORM))
    {
        const char* FmtName = GetTextureFormatAttribs(Desc.Format).Name;
        LOG_WARNING_MESSAGE(FmtName, " texture is created with BIND_RENDER_TARGET flag set.\n"
                                     "There might be an issue in OpenGL driver on NVidia hardware: when rendering to SNORM textures, all negative values are clamped to zero.\n"
                                     "Use UNORM format instead.");
    }

    if (Desc.MiscFlags & MISC_TEXTURE_FLAG_MEMORYLESS)
    {
        const AdapterMemoryInfo& MemInfo = AdapterInfo.Memory;

        if (MemInfo.MemorylessTextureBindFlags == BIND_NONE)
            LOG_TEXTURE_ERROR_AND_THROW("Memoryless textures are not supported by device");

        if ((Desc.BindFlags & MemInfo.MemorylessTextureBindFlags) != Desc.BindFlags)
            LOG_TEXTURE_ERROR_AND_THROW("BindFlags ", GetBindFlagsString(Desc.BindFlags & ~MemInfo.MemorylessTextureBindFlags), " are not supported for memoryless textures.");

        if (Desc.Usage != USAGE_DEFAULT)
            LOG_TEXTURE_ERROR_AND_THROW("Memoryless attachment requires USAGE_DEFAULT.");

        if (Desc.CPUAccessFlags != 0)
            LOG_TEXTURE_ERROR_AND_THROW("Memoryless attachment requires CPUAccessFlags to be NONE.");

        if (Desc.MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS)
            LOG_TEXTURE_ERROR_AND_THROW("Memoryless attachment is not compatible with mipmap generation.");
    }

    if (Desc.Usage == USAGE_STAGING)
    {
        if (Desc.BindFlags != 0)
            LOG_TEXTURE_ERROR_AND_THROW("Staging textures cannot be bound to any GPU pipeline stage.");

        if (Desc.MiscFlags & MISC_TEXTURE_FLAG_GENERATE_MIPS)
            LOG_TEXTURE_ERROR_AND_THROW("Mipmaps cannot be autogenerated for staging textures.");

        if (Desc.CPUAccessFlags == 0)
            LOG_TEXTURE_ERROR_AND_THROW("Staging textures must specify CPU access flags.");

        if ((Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) == (CPU_ACCESS_READ | CPU_ACCESS_WRITE))
            LOG_TEXTURE_ERROR_AND_THROW("Staging textures must use exactly one of ACCESS_READ or ACCESS_WRITE flags.");
    }
    else if (Desc.Usage == USAGE_UNIFIED)
    {
        LOG_TEXTURE_ERROR_AND_THROW("USAGE_UNIFIED textures are currently not supported.");
    }

    if (Desc.Usage == USAGE_DYNAMIC &&
        PlatformMisc::CountOneBits(Desc.ImmediateContextMask) > 1)
    {
        // Dynamic textures always use backing resource that requires implicit state transitions
        // in map/unmap operations, which is not safe in multiple contexts.
        LOG_TEXTURE_ERROR_AND_THROW("USAGE_DYNAMIC textures may only be used in one immediate device context.");
    }

    const ShadingRateProperties& SRProps = pDevice->GetAdapterInfo().ShadingRate;
    if (Desc.MiscFlags & MISC_TEXTURE_FLAG_SUBSAMPLED)
    {
        if (!pDevice->GetDeviceInfo().Features.VariableRateShading)
            LOG_TEXTURE_ERROR_AND_THROW("MISC_TEXTURE_FLAG_SUBSAMPLED requires VariableRateShading feature.");

        if (pDevice->GetDeviceInfo().IsMetalDevice())
            LOG_TEXTURE_ERROR_AND_THROW("MISC_TEXTURE_FLAG_SUBSAMPLED is not supported in Metal, use IRasterizationRateMapMtl to implement VRS in Metal");

        if ((SRProps.CapFlags & SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET) == 0)
            LOG_TEXTURE_ERROR_AND_THROW("MISC_TEXTURE_FLAG_SUBSAMPLED requires SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET capability.");

        if ((Desc.BindFlags & (BIND_RENDER_TARGET | BIND_DEPTH_STENCIL)) == 0)
            LOG_TEXTURE_ERROR_AND_THROW("Subsampled texture must use one of BIND_RENDER_TARGET or BIND_DEPTH_STENCIL bind flags");

        if (Desc.BindFlags & BIND_SHADING_RATE)
            LOG_TEXTURE_ERROR_AND_THROW("MISC_TEXTURE_FLAG_SUBSAMPLED is not compatible with BIND_SHADING_RATE");
    }

    if (Desc.BindFlags & BIND_SHADING_RATE)
    {
        if (!pDevice->GetDeviceInfo().Features.VariableRateShading)
            LOG_TEXTURE_ERROR_AND_THROW("BIND_SHADING_RATE requires VariableRateShading feature.");

        if (pDevice->GetDeviceInfo().IsMetalDevice())
            LOG_TEXTURE_ERROR_AND_THROW("BIND_SHADING_RATE is not supported in Metal, use IRasterizationRateMapMtl instead.");

        if (DeviceInfo.IsMetalDevice())
            LOG_TEXTURE_ERROR_AND_THROW("BIND_FLAG_SHADING_RATE is not supported in Metal, use IRasterizationRateMapMtl instead.");

        if ((SRProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED) == 0)
            LOG_TEXTURE_ERROR_AND_THROW("BIND_SHADING_RATE requires SHADING_RATE_CAP_FLAG_TEXTURE_BASED capability.");

        if (Desc.SampleCount != 1)
            LOG_TEXTURE_ERROR_AND_THROW("BIND_SHADING_RATE is not allowed for multisample texture.");

        if (Desc.Type == RESOURCE_DIM_TEX_2D_ARRAY && Desc.ArraySize > 1 && (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY) == 0)
            LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture arrays require SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY capability");

        if (Desc.Usage != USAGE_DEFAULT && Desc.Usage != USAGE_IMMUTABLE)
            LOG_TEXTURE_ERROR_AND_THROW("Shading rate textures only allow USAGE_DEFAULT or USAGE_IMMUTABLE.");

        // For Direct3D12 and Vulkan with VK_EXT_fragment_density_map
        if (Desc.MipLevels != 1)
            LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture must have 1 mip level.");

        if ((Desc.BindFlags & ~SRProps.BindFlags) != 0)
            LOG_TEXTURE_ERROR_AND_THROW("the following bind flags are not allowed for a shading rate texture: ", GetBindFlagsString(Desc.BindFlags & ~SRProps.BindFlags, ", "), '.');

        // TODO: Vulkan allows to create 2D texture array and then use single slice for view even if SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY capability is not supported
        if (Desc.Type != RESOURCE_DIM_TEX_2D && !(Desc.Type == RESOURCE_DIM_TEX_2D_ARRAY && (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY) != 0))
            LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture must be 2D or 2D Array with SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY capability.");

        switch (SRProps.Format)
        {
            case SHADING_RATE_FORMAT_PALETTE:
                if (Desc.Format != TEX_FORMAT_R8_UINT)
                    LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture format must be R8_UINT.");
                break;

            case SHADING_RATE_FORMAT_UNORM8:
                if (Desc.Format != TEX_FORMAT_RG8_UNORM)
                    LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture format must be RG8_UNORM.");
                break;

            case SHADING_RATE_FORMAT_COL_ROW_FP32:
            default:
                LOG_TEXTURE_ERROR_AND_THROW("Shading rate texture is not supported.");
        }
    }

    if (Desc.Usage == USAGE_SPARSE)
    {
        VERIFY_TEXTURE(DeviceInfo.Features.SparseResources, "sparse texture requires SparseResources feature");

        const SparseResourceProperties& SparseRes = AdapterInfo.SparseResources;

        if ((Desc.MiscFlags & MISC_TEXTURE_FLAG_SPARSE_ALIASING) != 0)
            VERIFY_TEXTURE((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_ALIASED) != 0, "MISC_TEXTURE_FLAG_SPARSE_ALIASING flag requires SPARSE_RESOURCE_CAP_FLAG_ALIASED capability");

        static_assert(RESOURCE_DIM_NUM_DIMENSIONS == 9, "Please update the switch below to handle the new resource dimension type");
        switch (Desc.Type)
        {
            case RESOURCE_DIM_TEX_2D:
                VERIFY_TEXTURE((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) != 0,
                               "2D texture requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability");
                break;

            case RESOURCE_DIM_TEX_2D_ARRAY:
            case RESOURCE_DIM_TEX_CUBE:
            case RESOURCE_DIM_TEX_CUBE_ARRAY:
                VERIFY_TEXTURE((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) != 0,
                               "2D array or Cube sparse textures requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability");

                if ((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL) == 0)
                {
                    const SparseTextureProperties Props = GetStandardSparseTextureProperties(Desc);
                    const uint2                   MipSize{std::max(1u, Desc.Width >> Desc.MipLevels),
                                        std::max(1u, Desc.Height >> Desc.MipLevels)};
                    VERIFY_TEXTURE(MipSize.x >= Props.TileSize[0] && MipSize.y >= Props.TileSize[1],
                                   "2D array or Cube sparse texture with mip level count ", Desc.MipLevels,
                                   ", where the last mip with dimension (", MipSize.x, "x", MipSize.y, ") is less than the tile size (",
                                   Props.TileSize[0], "x", Props.TileSize[1], ") requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL capability");
                }
                break;

            case RESOURCE_DIM_TEX_3D:
                VERIFY_TEXTURE((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D) != 0,
                               "3D sparse texture requires SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D capability");
                break;

            case RESOURCE_DIM_TEX_1D:
            case RESOURCE_DIM_TEX_1D_ARRAY:
                LOG_TEXTURE_ERROR_AND_THROW("Sparse 1D textures are not supported");
                break;

            default:
                LOG_TEXTURE_ERROR_AND_THROW("unknown texture type");
        }
    }
    else
    {
        VERIFY_TEXTURE((Desc.MiscFlags & MISC_TEXTURE_FLAG_SPARSE_ALIASING) == 0,
                       "MiscFlags must not have MISC_TEXTURE_FLAG_SPARSE_ALIASING if usage is not USAGE_SPARSE");
    }
}